

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_upgrade_tls(connectdata *conn)

{
  CURLcode local_1c;
  CURLcode result;
  imap_conn *imapc;
  connectdata *conn_local;
  
  local_1c = CURLE_NOT_BUILT_IN;
  if (((conn->proto).imapc.ssldone & 1U) != 0) {
    local_1c = imap_state_login(conn);
    state(conn,IMAP_STOP);
  }
  return local_1c;
}

Assistant:

static CURLcode imap_state_upgrade_tls(struct connectdata *conn)
{
  struct imap_conn *imapc = &conn->proto.imapc;
  CURLcode result;

  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &imapc->ssldone);

  if(imapc->ssldone) {
    imap_to_imaps(conn);
    result = imap_state_login(conn);
    state(conn, IMAP_STOP);
  }

  return result;
}